

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

_Bool hdr_record_values_atomic(hdr_histogram *h,int64_t value,int64_t count)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if ((-1 < value) && (value <= h->highest_trackable_value)) {
    uVar3 = h->sub_bucket_mask | value;
    lVar2 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar4 = ((uint)lVar2 ^ 0x3f) + h->sub_bucket_half_count_magnitude + h->unit_magnitude;
    iVar4 = ((0x40 - iVar4 << ((byte)h->sub_bucket_half_count_magnitude & 0x1f)) -
            h->sub_bucket_half_count) +
            (int)((ulong)value >> (((char)h->unit_magnitude - (char)iVar4) + 0x3fU & 0x3f));
    if ((-1 < iVar4) && (iVar1 = h->counts_len, iVar4 < iVar1)) {
      if (h->normalizing_index_offset != 0) {
        iVar4 = iVar4 - h->normalizing_index_offset;
        iVar5 = 0;
        if (iVar1 <= iVar4) {
          iVar5 = -iVar1;
        }
        if (iVar4 < 0) {
          iVar5 = iVar1;
        }
        iVar4 = iVar4 + iVar5;
      }
      LOCK();
      h->counts[iVar4] = h->counts[iVar4] + count;
      UNLOCK();
      LOCK();
      h->total_count = h->total_count + count;
      UNLOCK();
      do {
        lVar2 = h->min_value;
        if ((value == 0) || (lVar2 <= value)) break;
        LOCK();
        bVar6 = lVar2 == h->min_value;
        if (bVar6) {
          h->min_value = value;
        }
        UNLOCK();
      } while (!bVar6);
      do {
        lVar2 = h->max_value;
        if (value <= lVar2) {
          return true;
        }
        LOCK();
        bVar6 = lVar2 == h->max_value;
        if (bVar6) {
          h->max_value = value;
        }
        UNLOCK();
      } while (!bVar6);
      return true;
    }
  }
  return false;
}

Assistant:

bool hdr_record_values_atomic(struct hdr_histogram* h, int64_t value, int64_t count)
{
    int32_t counts_index;

    if (value < 0 || h->highest_trackable_value < value)
    {
        return false;
    }

    counts_index = counts_index_for(h, value);

    if (counts_index < 0 || h->counts_len <= counts_index)
    {
        return false;
    }

    counts_inc_normalised_atomic(h, counts_index, count);
    update_min_max_atomic(h, value);

    return true;
}